

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O3

void google::protobuf::internal::ReflectionOps::DiscardUnknownFields(Message *message)

{
  int iVar1;
  undefined4 extraout_var;
  UnknownFieldSet *this;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  long *plVar2;
  
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])();
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  this = (UnknownFieldSet *)(**(code **)(*plVar2 + 0x18))(plVar2,message);
  if (this->fields_ !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    UnknownFieldSet::ClearFallback(this);
  }
  (**(code **)(*plVar2 + 0x80))(plVar2,message);
  return;
}

Assistant:

void ReflectionOps::DiscardUnknownFields(Message* message) {
  const Reflection* reflection = message->GetReflection();

  reflection->MutableUnknownFields(message)->Clear();

  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (field->is_repeated()) {
        int size = reflection->FieldSize(*message, field);
        for (int j = 0; j < size; j++) {
          reflection->MutableRepeatedMessage(message, field, j)
                    ->DiscardUnknownFields();
        }
      } else {
        reflection->MutableMessage(message, field)->DiscardUnknownFields();
      }
    }
  }
}